

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void wasm::EffectAnalyzer::InternalAnalyzer::scan(InternalAnalyzer *self,Expression **currp)

{
  Expression *pEVar1;
  long lVar2;
  code *func;
  ulong uVar3;
  
  pEVar1 = *currp;
  if (pEVar1->_id == TryTableId) {
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doEndTryTable,currp);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                       ::doVisitTryTable,currp);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,scan,(Expression **)(pEVar1 + 1));
    func = doStartTryTable;
LAB_006b1dda:
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,func,currp);
    return;
  }
  if (pEVar1->_id != TryId) {
    PostWalker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::scan(self,currp);
    return;
  }
  Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
  ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
              *)self,Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                     ::doVisitTry,currp);
  Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
  ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
              *)self,doEndCatch,currp);
  if (pEVar1->_id == TryId) {
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar2 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar2 = lVar2 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
        ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                    *)self,scan,(Expression **)(pEVar1[4].type.id + lVar2));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doStartCatch,currp);
    if (pEVar1->_id == TryId) {
      Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
      ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                  *)self,scan,(Expression **)(pEVar1 + 2));
      func = doStartTry;
      goto LAB_006b1dda;
    }
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Try]");
}

Assistant:

static void scan(InternalAnalyzer* self, Expression** currp) {
      Expression* curr = *currp;
      // We need to decrement try depth before catch starts, so handle it
      // separately
      if (curr->is<Try>()) {
        self->pushTask(doVisitTry, currp);
        self->pushTask(doEndCatch, currp);
        auto& catchBodies = curr->cast<Try>()->catchBodies;
        for (int i = int(catchBodies.size()) - 1; i >= 0; i--) {
          self->pushTask(scan, &catchBodies[i]);
        }
        self->pushTask(doStartCatch, currp);
        self->pushTask(scan, &curr->cast<Try>()->body);
        self->pushTask(doStartTry, currp);
        return;
      }
      if (auto* tryTable = curr->dynCast<TryTable>()) {
        // We need to increment try depth before starting.
        self->pushTask(doEndTryTable, currp);
        self->pushTask(doVisitTryTable, currp);
        self->pushTask(scan, &tryTable->body);
        self->pushTask(doStartTryTable, currp);
        return;
      }
      PostWalker<InternalAnalyzer, OverriddenVisitor<InternalAnalyzer>>::scan(
        self, currp);
    }